

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O2

void Omega_h::migrate_mesh(Mesh *mesh,Dist *new_elems2old_owners,Omega_h_Parting mode,bool verbose)

{
  bool bVar1;
  Int IVar2;
  LO LVar3;
  I32 IVar4;
  int iVar5;
  ostream *poVar6;
  int iVar7;
  LO msg;
  long lVar8;
  ScopedTimer omega_h_scoped_function_timer;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_a58;
  HostRead<int> msgs2ranks_h;
  Write<int> local_a38;
  CommPtr comm;
  Write<int> local_a18;
  Adj local_a08;
  Dist new_ents2old_owners;
  Dist new_verts2old_owners;
  Dist old_owners2new_ents;
  Adj local_828;
  LOs msg_content_size;
  Dist local_768;
  Dist local_6d8;
  Dist local_648;
  Dist local_5b8;
  Dist local_528;
  Dist local_498;
  Mesh new_mesh;
  
  std::__cxx11::string::string
            ((string *)&old_owners2new_ents,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_migrate.cpp"
             ,(allocator *)&msg_content_size);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &new_ents2old_owners,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &old_owners2new_ents,":");
  std::__cxx11::to_string((string *)&new_verts2old_owners,0xc3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_mesh,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &new_ents2old_owners,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &new_verts2old_owners);
  begin_code("migrate_mesh",(char *)new_mesh._0_8_);
  std::__cxx11::string::~string((string *)&new_mesh);
  std::__cxx11::string::~string((string *)&new_verts2old_owners);
  std::__cxx11::string::~string((string *)&new_ents2old_owners);
  std::__cxx11::string::~string((string *)&old_owners2new_ents);
  iVar7 = 0;
  while( true ) {
    IVar2 = Mesh::dim(mesh);
    if (IVar2 < iVar7) {
      Mesh::copy_meta(&new_mesh,mesh);
      Mesh::comm((Mesh *)&comm);
      IVar2 = Mesh::dim(mesh);
      if (verbose) {
        std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_a58,&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
        Dist::Dist(&local_768,new_elems2old_owners);
        Dist::msgs2ranks(&old_owners2new_ents);
        Dist::msgs2content(&new_verts2old_owners);
        Write<int>::Write((Write<int> *)&local_a08,(Write<int> *)&new_verts2old_owners);
        std::__cxx11::string::string((string *)&new_ents2old_owners,"",(allocator *)&local_a38);
        get_degrees((Omega_h *)&msg_content_size,(LOs *)&local_a08,(string *)&new_ents2old_owners);
        std::__cxx11::string::~string((string *)&new_ents2old_owners);
        Write<int>::~Write((Write<int> *)&local_a08);
        Write<int>::Write(&local_a38,&msg_content_size.write_);
        HostRead<int>::HostRead
                  ((HostRead<int> *)&new_ents2old_owners,(Read<signed_char> *)&local_a38);
        Write<int>::~Write(&local_a38);
        Write<int>::Write(&local_a18,(Write<int> *)&old_owners2new_ents);
        HostRead<int>::HostRead(&msgs2ranks_h,(Read<signed_char> *)&local_a18);
        Write<int>::~Write(&local_a18);
        lVar8 = 0;
        iVar7 = 0;
        while( true ) {
          LVar3 = HostRead<int>::size(&msgs2ranks_h);
          if (LVar3 <= lVar8) break;
          iVar5 = *(int *)((long)msgs2ranks_h.read_.write_.shared_alloc_.direct_ptr + lVar8 * 4);
          IVar4 = Comm::rank(local_a58._M_ptr);
          if (iVar5 == IVar4) {
            iVar7 = *(int *)((long)&(new_ents2old_owners.parent_comm_.
                                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar8 * 4);
          }
          lVar8 = lVar8 + 1;
        }
        iVar5 = Read<int>::last((Read<signed_char> *)&new_verts2old_owners);
        Comm::allreduce<long>(local_a58._M_ptr,(long)iVar5,OMEGA_H_SUM);
        Comm::allreduce<long>(local_a58._M_ptr,(long)(iVar5 - iVar7),OMEGA_H_SUM);
        IVar4 = Comm::rank(local_a58._M_ptr);
        if (IVar4 == 0) {
          poVar6 = std::operator<<((ostream *)&std::cout,"migration pulling (");
          poVar6 = std::ostream::_M_insert<long>((long)poVar6);
          poVar6 = std::operator<<(poVar6," remote) / (");
          poVar6 = std::ostream::_M_insert<long>((long)poVar6);
          std::operator<<(poVar6," total) elements\n");
        }
        Write<int>::~Write((Write<int> *)&msgs2ranks_h);
        Write<int>::~Write((Write<int> *)&new_ents2old_owners);
        Write<int>::~Write(&msg_content_size.write_);
        Write<int>::~Write((Write<int> *)&new_verts2old_owners);
        Write<int>::~Write((Write<int> *)&old_owners2new_ents);
        Dist::~Dist(&local_768);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a58._M_refcount);
      }
      Dist::Dist(&new_ents2old_owners,new_elems2old_owners);
      Dist::invert(&old_owners2new_ents,&new_ents2old_owners);
      for (; 0 < IVar2; IVar2 = IVar2 + -1) {
        local_a08.codes.write_.shared_alloc_.alloc = (Alloc *)0x0;
        local_a08.codes.write_.shared_alloc_.direct_ptr = (pointer)0x0;
        local_a08.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)0x0;
        local_a08.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (pointer)0x0;
        local_a08.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)0x0;
        local_a08.super_Graph.a2ab.write_.shared_alloc_.direct_ptr = (void *)0x0;
        Dist::Dist(&new_verts2old_owners);
        Dist::Dist(&local_528,&old_owners2new_ents);
        push_down(mesh,IVar2,IVar2 + -1,&local_528,&local_a08,&new_verts2old_owners);
        Dist::~Dist(&local_528);
        Adj::Adj(&local_828,&local_a08);
        Mesh::set_ents(&new_mesh,IVar2,&local_828);
        Adj::~Adj(&local_828);
        Dist::invert((Dist *)&msg_content_size,&old_owners2new_ents);
        Dist::operator=(&new_ents2old_owners,(Dist *)&msg_content_size);
        Dist::~Dist((Dist *)&msg_content_size);
        Dist::Dist(&local_5b8,&new_ents2old_owners);
        Dist::Dist(&local_498,&old_owners2new_ents);
        push_ents(mesh,&new_mesh,IVar2,&local_5b8,&local_498,mode);
        Dist::~Dist(&local_498);
        Dist::~Dist(&local_5b8);
        Dist::operator=(&old_owners2new_ents,&new_verts2old_owners);
        Dist::~Dist(&new_verts2old_owners);
        Adj::~Adj(&local_a08);
      }
      Dist::invert(&new_verts2old_owners,&old_owners2new_ents);
      LVar3 = Dist::nitems(&new_verts2old_owners);
      Mesh::set_verts(&new_mesh,LVar3);
      Dist::Dist(&local_648,&new_verts2old_owners);
      Dist::Dist(&local_6d8,&old_owners2new_ents);
      push_ents(mesh,&new_mesh,0,&local_648,&local_6d8,mode);
      Dist::~Dist(&local_6d8);
      Dist::~Dist(&local_648);
      Mesh::operator=(mesh,&new_mesh);
      iVar7 = 0;
      while( true ) {
        IVar2 = Mesh::dim(mesh);
        if (IVar2 < iVar7) {
          Dist::~Dist(&new_verts2old_owners);
          Dist::~Dist(&old_owners2new_ents);
          Dist::~Dist(&new_ents2old_owners);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    );
          Mesh::~Mesh(&new_mesh);
          ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
          return;
        }
        std::__cxx11::string::string((string *)&msg_content_size,"global",(allocator *)&local_a08);
        bVar1 = Mesh::has_tag(mesh,iVar7,(string *)&msg_content_size);
        if (!bVar1) break;
        std::__cxx11::string::~string((string *)&msg_content_size);
        iVar7 = iVar7 + 1;
      }
      fail("assertion %s failed at %s +%d\n","mesh->has_tag(d, \"global\")",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_migrate.cpp"
           ,0xdf);
    }
    std::__cxx11::string::string((string *)&new_mesh,"global",(allocator *)&new_ents2old_owners);
    bVar1 = Mesh::has_tag(mesh,iVar7,(string *)&new_mesh);
    if (!bVar1) break;
    std::__cxx11::string::~string((string *)&new_mesh);
    iVar7 = iVar7 + 1;
  }
  fail("assertion %s failed at %s +%d\n","mesh->has_tag(d, \"global\")",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_migrate.cpp"
       ,0xc5);
}

Assistant:

void migrate_mesh(
    Mesh* mesh, Dist new_elems2old_owners, Omega_h_Parting mode, bool verbose) {
  OMEGA_H_TIME_FUNCTION;
  for (Int d = 0; d <= mesh->dim(); ++d) {
    OMEGA_H_CHECK(mesh->has_tag(d, "global"));
  }
  auto new_mesh = mesh->copy_meta();
  auto comm = mesh->comm();
  auto dim = mesh->dim();
  if (verbose) print_migrate_stats(comm, new_elems2old_owners);
  Dist new_ents2old_owners = new_elems2old_owners;
  auto old_owners2new_ents = new_ents2old_owners.invert();
  for (Int d = dim; d > VERT; --d) {
    Adj high2low;
    Dist old_low_owners2new_lows;
    push_down(
        mesh, d, d - 1, old_owners2new_ents, high2low, old_low_owners2new_lows);
    new_mesh.set_ents(d, high2low);
    new_ents2old_owners = old_owners2new_ents.invert();
    push_ents(
        mesh, &new_mesh, d, new_ents2old_owners, old_owners2new_ents, mode);
    old_owners2new_ents = old_low_owners2new_lows;
  }
  auto new_verts2old_owners = old_owners2new_ents.invert();
  auto nnew_verts = new_verts2old_owners.nitems();
  new_mesh.set_verts(nnew_verts);
  push_ents(
      mesh, &new_mesh, VERT, new_verts2old_owners, old_owners2new_ents, mode);
  *mesh = new_mesh;
  for (Int d = 0; d <= mesh->dim(); ++d) {
    OMEGA_H_CHECK(mesh->has_tag(d, "global"));
  }
}